

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlAutomataStatePtr
xmlAutomataNewTransition2
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,
          xmlChar *token2,void *data)

{
  int iVar1;
  int iVar2;
  xmlRegAtomPtr atom;
  size_t sVar3;
  size_t sVar4;
  xmlChar *__dest;
  
  if (token == (xmlChar *)0x0 || (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0)) {
    return (xmlAutomataStatePtr)0x0;
  }
  atom = xmlRegNewAtom(am,XML_REGEXP_STRING);
  if (atom == (xmlRegAtomPtr)0x0) {
    return (xmlAutomataStatePtr)0x0;
  }
  atom->data = data;
  if ((token2 == (xmlChar *)0x0) || (*token2 == '\0')) {
    __dest = xmlStrdup(token);
  }
  else {
    sVar3 = strlen((char *)token2);
    sVar4 = strlen((char *)token);
    iVar2 = (int)sVar3;
    iVar1 = (int)sVar4;
    __dest = (xmlChar *)(*xmlMalloc)((long)(iVar2 + iVar1 + 2));
    if (__dest == (xmlChar *)0x0) goto LAB_00173e35;
    memcpy(__dest,token,(long)iVar1);
    __dest[iVar1] = '|';
    memcpy(__dest + (iVar1 + 1),token2,(long)iVar2);
    __dest[(long)(iVar2 + iVar1) + 1] = '\0';
  }
  atom->valuep = __dest;
  iVar2 = xmlFAGenerateTransitions(am,from,to,atom);
  if (-1 < iVar2) {
    if (to == (xmlAutomataStatePtr)0x0) {
      return am->state;
    }
    return to;
  }
LAB_00173e35:
  xmlRegFreeAtom(atom);
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewTransition2(xmlAutomataPtr am, xmlAutomataStatePtr from,
			  xmlAutomataStatePtr to, const xmlChar *token,
			  const xmlChar *token2, void *data) {
    xmlRegAtomPtr atom;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->data = data;
    if ((token2 == NULL) || (*token2 == 0)) {
	atom->valuep = xmlStrdup(token);
    } else {
	int lenn, lenp;
	xmlChar *str;

	lenn = strlen((char *) token2);
	lenp = strlen((char *) token);

	str = xmlMalloc(lenn + lenp + 2);
	if (str == NULL) {
	    xmlRegFreeAtom(atom);
	    return(NULL);
	}
	memcpy(&str[0], token, lenp);
	str[lenp] = '|';
	memcpy(&str[lenp + 1], token2, lenn);
	str[lenn + lenp + 1] = 0;

	atom->valuep = str;
    }

    if (xmlFAGenerateTransitions(am, from, to, atom) < 0) {
        xmlRegFreeAtom(atom);
	return(NULL);
    }
    if (to == NULL)
	return(am->state);
    return(to);
}